

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

void __thiscall el::base::LogFormat::updateFormatSpec(LogFormat *this)

{
  Level LVar1;
  uint uVar2;
  allocator local_52;
  allocator local_51;
  string_t local_50;
  string_t local_30;
  
  LVar1 = this->m_level;
  if (LVar1 == Trace) {
    std::__cxx11::string::string((string *)&local_50,"%level",&local_51);
    std::__cxx11::string::string((string *)&local_30,"TRACE",&local_52);
    utils::Str::replaceFirstWithEscape(&this->m_format,&local_50,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_50,"%levshort",&local_51);
    std::__cxx11::string::string((string *)&local_30,"T",&local_52);
    utils::Str::replaceFirstWithEscape(&this->m_format,&local_50,&local_30);
  }
  else if (LVar1 == Info) {
    std::__cxx11::string::string((string *)&local_50,"%level",&local_51);
    std::__cxx11::string::string((string *)&local_30,"INFO",&local_52);
    utils::Str::replaceFirstWithEscape(&this->m_format,&local_50,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_50,"%levshort",&local_51);
    std::__cxx11::string::string((string *)&local_30,"I",&local_52);
    utils::Str::replaceFirstWithEscape(&this->m_format,&local_50,&local_30);
  }
  else if (LVar1 == Fatal) {
    std::__cxx11::string::string((string *)&local_50,"%level",&local_51);
    std::__cxx11::string::string((string *)&local_30,"FATAL",&local_52);
    utils::Str::replaceFirstWithEscape(&this->m_format,&local_50,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_50,"%levshort",&local_51);
    std::__cxx11::string::string((string *)&local_30,"F",&local_52);
    utils::Str::replaceFirstWithEscape(&this->m_format,&local_50,&local_30);
  }
  else if (LVar1 == Error) {
    std::__cxx11::string::string((string *)&local_50,"%level",&local_51);
    std::__cxx11::string::string((string *)&local_30,"ERROR",&local_52);
    utils::Str::replaceFirstWithEscape(&this->m_format,&local_50,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_50,"%levshort",&local_51);
    std::__cxx11::string::string((string *)&local_30,"E",&local_52);
    utils::Str::replaceFirstWithEscape(&this->m_format,&local_50,&local_30);
  }
  else if (LVar1 == Warning) {
    std::__cxx11::string::string((string *)&local_50,"%level",&local_51);
    std::__cxx11::string::string((string *)&local_30,"WARNING",&local_52);
    utils::Str::replaceFirstWithEscape(&this->m_format,&local_50,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_50,"%levshort",&local_51);
    std::__cxx11::string::string((string *)&local_30,"W",&local_52);
    utils::Str::replaceFirstWithEscape(&this->m_format,&local_50,&local_30);
  }
  else if (LVar1 == Verbose) {
    std::__cxx11::string::string((string *)&local_50,"%level",&local_51);
    std::__cxx11::string::string((string *)&local_30,"VERBOSE",&local_52);
    utils::Str::replaceFirstWithEscape(&this->m_format,&local_50,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_50,"%levshort",&local_51);
    std::__cxx11::string::string((string *)&local_30,"V",&local_52);
    utils::Str::replaceFirstWithEscape(&this->m_format,&local_50,&local_30);
  }
  else {
    if (LVar1 != Debug) goto LAB_001153b8;
    std::__cxx11::string::string((string *)&local_50,"%level",&local_51);
    std::__cxx11::string::string((string *)&local_30,"DEBUG",&local_52);
    utils::Str::replaceFirstWithEscape(&this->m_format,&local_50,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_50,"%levshort",&local_51);
    std::__cxx11::string::string((string *)&local_30,"D",&local_52);
    utils::Str::replaceFirstWithEscape(&this->m_format,&local_50,&local_30);
  }
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
LAB_001153b8:
  uVar2 = this->m_flags;
  if ((char)uVar2 < '\0') {
    std::__cxx11::string::string((string *)&local_50,"%user",(allocator *)&local_30);
    utils::Str::replaceFirstWithEscape(&this->m_format,&local_50,(string_t *)&this->m_currentUser);
    std::__cxx11::string::~string((string *)&local_50);
    uVar2 = this->m_flags;
  }
  if ((uVar2 >> 8 & 1) != 0) {
    std::__cxx11::string::string((string *)&local_50,"%host",(allocator *)&local_30);
    utils::Str::replaceFirstWithEscape(&this->m_format,&local_50,(string_t *)&this->m_currentHost);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void LogFormat::updateFormatSpec(void) {
  // Do not use switch over strongly typed enums because Intel C++ compilers dont support them yet.
  if (m_level == Level::Debug) {
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kSeverityLevelFormatSpecifier,
        base::consts::kDebugLevelLogValue);
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kSeverityLevelShortFormatSpecifier,
        base::consts::kDebugLevelShortLogValue);
  } else if (m_level == Level::Info) {
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kSeverityLevelFormatSpecifier,
        base::consts::kInfoLevelLogValue);
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kSeverityLevelShortFormatSpecifier,
        base::consts::kInfoLevelShortLogValue);
  } else if (m_level == Level::Warning) {
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kSeverityLevelFormatSpecifier,
        base::consts::kWarningLevelLogValue);
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kSeverityLevelShortFormatSpecifier,
        base::consts::kWarningLevelShortLogValue);
  } else if (m_level == Level::Error) {
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kSeverityLevelFormatSpecifier,
        base::consts::kErrorLevelLogValue);
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kSeverityLevelShortFormatSpecifier,
        base::consts::kErrorLevelShortLogValue);
  } else if (m_level == Level::Fatal) {
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kSeverityLevelFormatSpecifier,
        base::consts::kFatalLevelLogValue);
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kSeverityLevelShortFormatSpecifier,
        base::consts::kFatalLevelShortLogValue);
  } else if (m_level == Level::Verbose) {
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kSeverityLevelFormatSpecifier,
        base::consts::kVerboseLevelLogValue);
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kSeverityLevelShortFormatSpecifier,
        base::consts::kVerboseLevelShortLogValue);
  } else if (m_level == Level::Trace) {
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kSeverityLevelFormatSpecifier,
        base::consts::kTraceLevelLogValue);
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kSeverityLevelShortFormatSpecifier,
        base::consts::kTraceLevelShortLogValue);
  }
  if (hasFlag(base::FormatFlags::User)) {
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kCurrentUserFormatSpecifier,
        m_currentUser);
  }
  if (hasFlag(base::FormatFlags::Host)) {
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kCurrentHostFormatSpecifier,
        m_currentHost);
  }
  // Ignore Level::Global and Level::Unknown
}